

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3EndTable(Parse *pParse,Token *pCons,Token *pEnd,Select *pSelect)

{
  char cVar1;
  sqlite3 *db;
  Table *p;
  ExprList *pEVar2;
  int iVar3;
  Vdbe *p_00;
  Table *pTable;
  char *pcVar4;
  void *pvVar5;
  char *pcVar6;
  uint uVar7;
  Schema **ppSVar8;
  char *pcVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  NameContext sNC;
  SrcList sSrc;
  
  if (((pEnd != (Token *)0x0 || pSelect != (Select *)0x0) &&
      (db = pParse->db, db->mallocFailed == '\0')) && (p = pParse->pNewTable, p != (Table *)0x0)) {
    if (p->pSchema == (Schema *)0x0) {
      uVar11 = 0xfff0bdc0;
    }
    else {
      uVar7 = db->nDb;
      if ((int)uVar7 < 1) {
        uVar11 = 0;
      }
      else {
        ppSVar8 = &db->aDb->pSchema;
        uVar11 = 0;
        do {
          if (*ppSVar8 == p->pSchema) goto LAB_0014bce1;
          uVar11 = uVar11 + 1;
          ppSVar8 = ppSVar8 + 4;
        } while (uVar7 != uVar11);
        uVar11 = (ulong)uVar7;
      }
    }
LAB_0014bce1:
    if (p->pCheck != (ExprList *)0x0) {
      sNC.pNext = (NameContext *)0x0;
      sNC.nRef = 0;
      sNC.nErr = 0;
      sNC.pEList = (ExprList *)0x0;
      sNC.pAggInfo = (AggInfo *)0x0;
      sNC.pSrcList = &sSrc;
      sSrc.a[0].pSchema = (Schema *)0x0;
      sSrc.a[0].zDatabase = (char *)0x0;
      sSrc.a[0].zAlias = (char *)0x0;
      sSrc.a[0].pSelect = (Select *)0x0;
      sSrc.a[0].addrFillSub = 0;
      sSrc.a[0].regReturn = 0;
      sSrc.a[0].pOn = (Expr *)0x0;
      sSrc.a[0].pUsing = (IdList *)0x0;
      sSrc.a[0].colUsed = 0;
      sSrc.a[0].zIndex = (char *)0x0;
      sSrc.a[0].pIndex = (Index *)0x0;
      sSrc.nSrc = 1;
      sSrc.nAlloc = 0;
      sSrc._4_4_ = 0;
      sSrc.a[0].zName = p->zName;
      sSrc.a[0].jointype = '\0';
      sSrc.a[0]._57_1_ = 0;
      sSrc.a[0].iSelectId = '\0';
      sSrc.a[0]._59_1_ = 0;
      sSrc.a[0].iCursor = -1;
      sNC.ncFlags = '\x04';
      sNC._49_7_ = 0;
      pEVar2 = p->pCheck;
      sNC.pParse = pParse;
      sSrc.a[0].pTab = p;
      if (0 < pEVar2->nExpr) {
        lVar12 = 0;
        lVar10 = 0;
        do {
          iVar3 = sqlite3ResolveExprNames(&sNC,*(Expr **)((long)&pEVar2->a->pExpr + lVar12));
          if (iVar3 != 0) {
            return;
          }
          lVar10 = lVar10 + 1;
          lVar12 = lVar12 + 0x20;
        } while (lVar10 < pEVar2->nExpr);
      }
    }
    if ((db->init).busy == '\0') {
      p_00 = sqlite3GetVdbe(pParse);
      if (p_00 == (Vdbe *)0x0) {
        return;
      }
      sqlite3VdbeAddOp3(p_00,0x2d,0,0,0);
      pcVar9 = "view";
      if (p->pSelect == (Select *)0x0) {
        pcVar9 = "table";
      }
      iVar3 = (int)uVar11;
      if (pSelect == (Select *)0x0) {
        pcVar4 = "VIEW";
        if (p->pSelect == (Select *)0x0) {
          pcVar4 = "TABLE";
        }
        pcVar4 = sqlite3MPrintf(db,"CREATE %s %.*s",pcVar4,
                                (ulong)((*(int *)&pEnd->z - (int)(pParse->sNameToken).z) + 1));
      }
      else {
        sqlite3VdbeAddOp3(p_00,0x28,1,pParse->regRoot,iVar3);
        if (p_00->aOp != (Op *)0x0) {
          p_00->aOp[(long)p_00->nOp + -1].p5 = '\x02';
        }
        pParse->nTab = 2;
        sSrc.nSrc = 8;
        sSrc._4_4_ = 1;
        sSrc.a[0].pSchema = (Schema *)0x0;
        sqlite3Select(pParse,pSelect,(SelectDest *)&sSrc);
        sqlite3VdbeAddOp3(p_00,0x2d,1,0,0);
        if (pParse->nErr == 0) {
          pTable = sqlite3ResultSetOfSelect(pParse,pSelect);
          if (pTable == (Table *)0x0) {
            return;
          }
          p->nCol = pTable->nCol;
          p->aCol = pTable->aCol;
          pTable->nCol = 0;
          pTable->aCol = (Column *)0x0;
          sqlite3DeleteTable(db,pTable);
        }
        pcVar4 = createTableStmt(db,p);
      }
      pcVar6 = "sqlite_master";
      if (iVar3 == 1) {
        pcVar6 = "sqlite_temp_master";
      }
      sqlite3NestedParse(pParse,
                         "UPDATE %Q.%s SET type=\'%s\', name=%Q, tbl_name=%Q, rootpage=#%d, sql=%Q WHERE rowid=#%d"
                         ,db->aDb[iVar3].zName,pcVar6,pcVar9,p->zName,p->zName,
                         (ulong)(uint)pParse->regRoot,pcVar4,(ulong)(uint)pParse->regRowid);
      sqlite3DbFree(db,pcVar4);
      sqlite3ChangeCookie(pParse,iVar3);
      if (((p->tabFlags & 8) != 0) && ((db->aDb[iVar3].pSchema)->pSeqTab == (Table *)0x0)) {
        sqlite3NestedParse(pParse,"CREATE TABLE %Q.sqlite_sequence(name,seq)",db->aDb[iVar3].zName);
      }
      pcVar9 = sqlite3MPrintf(db,"tbl_name=\'%q\'",p->zName);
      sqlite3VdbeAddParseSchemaOp(p_00,iVar3,pcVar9);
    }
    else {
      p->tnum = (db->init).newTnum;
    }
    if ((db->init).busy != '\0') {
      pcVar9 = p->zName;
      if (pcVar9 == (char *)0x0) {
        uVar7 = 0;
      }
      else {
        uVar7 = 0xffffffff;
        pcVar4 = pcVar9;
        do {
          uVar7 = uVar7 + 1;
          cVar1 = *pcVar4;
          pcVar4 = pcVar4 + 1;
        } while (cVar1 != '\0');
        uVar7 = uVar7 & 0x3fffffff;
      }
      pvVar5 = sqlite3HashInsert(&p->pSchema->tblHash,pcVar9,uVar7,p);
      if (pvVar5 == (void *)0x0) {
        pParse->pNewTable = (Table *)0x0;
        *(byte *)&db->flags = (byte)db->flags | 2;
        if (p->pSelect == (Select *)0x0) {
          pcVar9 = (pParse->sNameToken).z;
          if (pCons->z != (char *)0x0) {
            pEnd = pCons;
          }
          iVar3 = sqlite3Utf8CharLen(pcVar9,*(int *)&pEnd->z - (int)pcVar9);
          p->addColOffset = iVar3 + 0xd;
        }
      }
      else {
        db->mallocFailed = '\x01';
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3EndTable(
  Parse *pParse,          /* Parse context */
  Token *pCons,           /* The ',' token after the last column defn. */
  Token *pEnd,            /* The final ')' token in the CREATE TABLE */
  Select *pSelect         /* Select from a "CREATE ... AS SELECT" */
){
  Table *p;
  sqlite3 *db = pParse->db;
  int iDb;

  if( (pEnd==0 && pSelect==0) || db->mallocFailed ){
    return;
  }
  p = pParse->pNewTable;
  if( p==0 ) return;

  assert( !db->init.busy || !pSelect );

  iDb = sqlite3SchemaToIndex(db, p->pSchema);

#ifndef SQLITE_OMIT_CHECK
  /* Resolve names in all CHECK constraint expressions.
  */
  if( p->pCheck ){
    SrcList sSrc;                   /* Fake SrcList for pParse->pNewTable */
    NameContext sNC;                /* Name context for pParse->pNewTable */
    ExprList *pList;                /* List of all CHECK constraints */
    int i;                          /* Loop counter */

    memset(&sNC, 0, sizeof(sNC));
    memset(&sSrc, 0, sizeof(sSrc));
    sSrc.nSrc = 1;
    sSrc.a[0].zName = p->zName;
    sSrc.a[0].pTab = p;
    sSrc.a[0].iCursor = -1;
    sNC.pParse = pParse;
    sNC.pSrcList = &sSrc;
    sNC.ncFlags = NC_IsCheck;
    pList = p->pCheck;
    for(i=0; i<pList->nExpr; i++){
      if( sqlite3ResolveExprNames(&sNC, pList->a[i].pExpr) ){
        return;
      }
    }
  }
#endif /* !defined(SQLITE_OMIT_CHECK) */

  /* If the db->init.busy is 1 it means we are reading the SQL off the
  ** "sqlite_master" or "sqlite_temp_master" table on the disk.
  ** So do not write to the disk again.  Extract the root page number
  ** for the table from the db->init.newTnum field.  (The page number
  ** should have been put there by the sqliteOpenCb routine.)
  */
  if( db->init.busy ){
    p->tnum = db->init.newTnum;
  }

  /* If not initializing, then create a record for the new table
  ** in the SQLITE_MASTER table of the database.
  **
  ** If this is a TEMPORARY table, write the entry into the auxiliary
  ** file instead of into the main database file.
  */
  if( !db->init.busy ){
    int n;
    Vdbe *v;
    char *zType;    /* "view" or "table" */
    char *zType2;   /* "VIEW" or "TABLE" */
    char *zStmt;    /* Text of the CREATE TABLE or CREATE VIEW statement */

    v = sqlite3GetVdbe(pParse);
    if( NEVER(v==0) ) return;

    sqlite3VdbeAddOp1(v, OP_Close, 0);

    /* 
    ** Initialize zType for the new view or table.
    */
    if( p->pSelect==0 ){
      /* A regular table */
      zType = "table";
      zType2 = "TABLE";
#ifndef SQLITE_OMIT_VIEW
    }else{
      /* A view */
      zType = "view";
      zType2 = "VIEW";
#endif
    }

    /* If this is a CREATE TABLE xx AS SELECT ..., execute the SELECT
    ** statement to populate the new table. The root-page number for the
    ** new table is in register pParse->regRoot.
    **
    ** Once the SELECT has been coded by sqlite3Select(), it is in a
    ** suitable state to query for the column names and types to be used
    ** by the new table.
    **
    ** A shared-cache write-lock is not required to write to the new table,
    ** as a schema-lock must have already been obtained to create it. Since
    ** a schema-lock excludes all other database users, the write-lock would
    ** be redundant.
    */
    if( pSelect ){
      SelectDest dest;
      Table *pSelTab;

      assert(pParse->nTab==1);
      sqlite3VdbeAddOp3(v, OP_OpenWrite, 1, pParse->regRoot, iDb);
      sqlite3VdbeChangeP5(v, OPFLAG_P2ISREG);
      pParse->nTab = 2;
      sqlite3SelectDestInit(&dest, SRT_Table, 1);
      sqlite3Select(pParse, pSelect, &dest);
      sqlite3VdbeAddOp1(v, OP_Close, 1);
      if( pParse->nErr==0 ){
        pSelTab = sqlite3ResultSetOfSelect(pParse, pSelect);
        if( pSelTab==0 ) return;
        assert( p->aCol==0 );
        p->nCol = pSelTab->nCol;
        p->aCol = pSelTab->aCol;
        pSelTab->nCol = 0;
        pSelTab->aCol = 0;
        sqlite3DeleteTable(db, pSelTab);
      }
    }

    /* Compute the complete text of the CREATE statement */
    if( pSelect ){
      zStmt = createTableStmt(db, p);
    }else{
      n = (int)(pEnd->z - pParse->sNameToken.z) + 1;
      zStmt = sqlite3MPrintf(db, 
          "CREATE %s %.*s", zType2, n, pParse->sNameToken.z
      );
    }

    /* A slot for the record has already been allocated in the 
    ** SQLITE_MASTER table.  We just need to update that slot with all
    ** the information we've collected.
    */
    sqlite3NestedParse(pParse,
      "UPDATE %Q.%s "
         "SET type='%s', name=%Q, tbl_name=%Q, rootpage=#%d, sql=%Q "
       "WHERE rowid=#%d",
      db->aDb[iDb].zName, SCHEMA_TABLE(iDb),
      zType,
      p->zName,
      p->zName,
      pParse->regRoot,
      zStmt,
      pParse->regRowid
    );
    sqlite3DbFree(db, zStmt);
    sqlite3ChangeCookie(pParse, iDb);

#ifndef SQLITE_OMIT_AUTOINCREMENT
    /* Check to see if we need to create an sqlite_sequence table for
    ** keeping track of autoincrement keys.
    */
    if( p->tabFlags & TF_Autoincrement ){
      Db *pDb = &db->aDb[iDb];
      assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
      if( pDb->pSchema->pSeqTab==0 ){
        sqlite3NestedParse(pParse,
          "CREATE TABLE %Q.sqlite_sequence(name,seq)",
          pDb->zName
        );
      }
    }
#endif

    /* Reparse everything to update our internal data structures */
    sqlite3VdbeAddParseSchemaOp(v, iDb,
               sqlite3MPrintf(db, "tbl_name='%q'", p->zName));
  }


  /* Add the table to the in-memory representation of the database.
  */
  if( db->init.busy ){
    Table *pOld;
    Schema *pSchema = p->pSchema;
    assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
    pOld = sqlite3HashInsert(&pSchema->tblHash, p->zName,
                             sqlite3Strlen30(p->zName),p);
    if( pOld ){
      assert( p==pOld );  /* Malloc must have failed inside HashInsert() */
      db->mallocFailed = 1;
      return;
    }
    pParse->pNewTable = 0;
    db->flags |= SQLITE_InternChanges;

#ifndef SQLITE_OMIT_ALTERTABLE
    if( !p->pSelect ){
      const char *zName = (const char *)pParse->sNameToken.z;
      int nName;
      assert( !pSelect && pCons && pEnd );
      if( pCons->z==0 ){
        pCons = pEnd;
      }
      nName = (int)((const char *)pCons->z - zName);
      p->addColOffset = 13 + sqlite3Utf8CharLen(zName, nName);
    }
#endif
  }
}